

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O1

QList<std::pair<double,_QPointF>_> * __thiscall
QGraphicsItemAnimation::translationList
          (QList<std::pair<double,_QPointF>_> *__return_storage_ptr__,QGraphicsItemAnimation *this)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  QPointF local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (pair<double,_QPointF> *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar2 = (uint)*(undefined8 *)(*(long *)(this + 0x10) + 0x140);
  QList<std::pair<double,_QPointF>_>::reserve(__return_storage_ptr__,(long)(int)uVar2);
  if (0 < (int)uVar2) {
    uVar3 = (ulong)(uVar2 & 0x7fffffff);
    lVar4 = 0;
    do {
      lVar1 = *(long *)(*(long *)(this + 0x10) + 0x138);
      local_40.xp = *(qreal *)(lVar1 + 8 + lVar4);
      local_40.yp = *(qreal *)(*(long *)(*(long *)(this + 0x10) + 0x150) + 8 + lVar4);
      QtPrivate::QPodArrayOps<std::pair<double,QPointF>>::emplace<double_const&,QPointF>
                ((QPodArrayOps<std::pair<double,QPointF>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(double *)(lVar1 + lVar4),&local_40);
      QList<std::pair<double,_QPointF>_>::end(__return_storage_ptr__);
      lVar4 = lVar4 + 0x10;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<std::pair<qreal, QPointF> > QGraphicsItemAnimation::translationList() const
{
    QList<std::pair<qreal, QPointF>> list;
    const int numTranslations = d->xTranslation.size();
    list.reserve(numTranslations);
    for (int i = 0; i < numTranslations; ++i)
        list.emplace_back(d->xTranslation.at(i).step,
                          QPointF(d->xTranslation.at(i).value, d->yTranslation.at(i).value));

    return list;
}